

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O1

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::SetNotNullInfo,duckdb::AlterEntryData,std::__cxx11::string_const&>
          (duckdb *this,AlterEntryData *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  SetNotNullInfo *this_00;
  string local_b8;
  AlterEntryData local_98;
  
  this_00 = (SetNotNullInfo *)operator_new(0x98);
  paVar1 = &local_98.catalog.field_2;
  local_98.catalog._M_dataplus._M_p = (args->catalog)._M_dataplus._M_p;
  paVar2 = &(args->catalog).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p == paVar2) {
    local_98.catalog.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_98.catalog.field_2._8_4_ = *(undefined4 *)((long)&(args->catalog).field_2 + 8);
    local_98.catalog.field_2._12_4_ = *(undefined4 *)((long)&(args->catalog).field_2 + 0xc);
    local_98.catalog._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.catalog.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_98.catalog._M_string_length = (args->catalog)._M_string_length;
  paVar3 = &local_98.schema.field_2;
  (args->catalog)._M_dataplus._M_p = (pointer)paVar2;
  (args->catalog)._M_string_length = 0;
  (args->catalog).field_2._M_local_buf[0] = '\0';
  local_98.schema._M_dataplus._M_p = (args->schema)._M_dataplus._M_p;
  paVar2 = &(args->schema).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p == paVar2) {
    local_98.schema.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_98.schema.field_2._8_4_ = *(undefined4 *)((long)&(args->schema).field_2 + 8);
    local_98.schema.field_2._12_4_ = *(undefined4 *)((long)&(args->schema).field_2 + 0xc);
    local_98.schema._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_98.schema.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_98.schema._M_string_length = (args->schema)._M_string_length;
  paVar4 = &local_98.name.field_2;
  (args->schema)._M_dataplus._M_p = (pointer)paVar2;
  (args->schema)._M_string_length = 0;
  (args->schema).field_2._M_local_buf[0] = '\0';
  local_98.name._M_dataplus._M_p = (args->name)._M_dataplus._M_p;
  paVar2 = &(args->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p == paVar2) {
    local_98.name.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_98.name.field_2._8_4_ = *(undefined4 *)((long)&(args->name).field_2 + 8);
    local_98.name.field_2._12_4_ = *(undefined4 *)((long)&(args->name).field_2 + 0xc);
    local_98.name._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_98.name.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_98.name._M_string_length = (args->name)._M_string_length;
  (args->name)._M_dataplus._M_p = (pointer)paVar2;
  (args->name)._M_string_length = 0;
  (args->name).field_2._M_local_buf[0] = '\0';
  local_98.if_not_found = args->if_not_found;
  pcVar5 = (args_1->_M_dataplus)._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar5,pcVar5 + args_1->_M_string_length);
  SetNotNullInfo::SetNotNullInfo(this_00,&local_98,&local_b8);
  *(SetNotNullInfo **)this = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar4) {
    operator_delete(local_98.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p != paVar3) {
    operator_delete(local_98.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}